

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildFloat1Double1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *instr_00;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *srcOpnd;
  RegSlot srcRegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  if (newOpcode != Fround_Db) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xb2f,"(newOpcode == Js::OpCodeAsmJs::Fround_Db)",
                       "newOpcode == Js::OpCodeAsmJs::Fround_Db");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Float);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyFloat32);
  IR::Opnd::SetValueType(&this_01->super_Opnd,ValueType::Float);
  instr_00 = IR::Instr::New(InlineMathFround,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func)
  ;
  AddInstr(this,instr_00,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildFloat1Double1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    Assert(newOpcode == Js::OpCodeAsmJs::Fround_Db);

    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat64);
    srcOpnd->SetValueType(ValueType::Float);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
    dstOpnd->SetValueType(ValueType::Float);

    IR::Instr * instr = IR::Instr::New(Js::OpCode::InlineMathFround, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}